

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O3

BaseStatistics *
duckdb::BaseStatistics::Deserialize
          (BaseStatistics *__return_storage_ptr__,Deserializer *deserializer)

{
  StatisticsType SVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  LogicalType *type;
  LogicalType local_48;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"has_null");
  iVar2 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"has_no_null");
  iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"distinct_count");
  iVar4 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  type = Deserializer::Get<duckdb::LogicalType_const&>(deserializer);
  SVar1 = GetStatsType(type);
  LogicalType::LogicalType(&local_48,type);
  BaseStatistics(__return_storage_ptr__,&local_48);
  LogicalType::~LogicalType(&local_48);
  __return_storage_ptr__->has_null = SUB41(iVar2,0);
  __return_storage_ptr__->has_no_null = SUB41(iVar3,0);
  __return_storage_ptr__->distinct_count = CONCAT44(extraout_var,iVar4);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x67,"type_stats");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  switch(SVar1) {
  case NUMERIC_STATS:
    NumericStats::Deserialize(deserializer,__return_storage_ptr__);
    break;
  case STRING_STATS:
    StringStats::Deserialize(deserializer,__return_storage_ptr__);
    break;
  case LIST_STATS:
    ListStats::Deserialize(deserializer,__return_storage_ptr__);
    break;
  case STRUCT_STATS:
    StructStats::Deserialize(deserializer,__return_storage_ptr__);
    break;
  case ARRAY_STATS:
    ArrayStats::Deserialize(deserializer,__return_storage_ptr__);
  }
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics BaseStatistics::Deserialize(Deserializer &deserializer) {
	auto has_null = deserializer.ReadProperty<bool>(100, "has_null");
	auto has_no_null = deserializer.ReadProperty<bool>(101, "has_no_null");
	auto distinct_count = deserializer.ReadProperty<idx_t>(102, "distinct_count");

	// Get the logical type from the deserializer context.
	auto &type = deserializer.Get<const LogicalType &>();
	auto stats_type = GetStatsType(type);

	BaseStatistics stats(type);

	stats.has_null = has_null;
	stats.has_no_null = has_no_null;
	stats.distinct_count = distinct_count;

	deserializer.ReadObject(103, "type_stats", [&](Deserializer &obj) {
		switch (stats_type) {
		case StatisticsType::NUMERIC_STATS:
			NumericStats::Deserialize(obj, stats);
			break;
		case StatisticsType::STRING_STATS:
			StringStats::Deserialize(obj, stats);
			break;
		case StatisticsType::LIST_STATS:
			ListStats::Deserialize(obj, stats);
			break;
		case StatisticsType::STRUCT_STATS:
			StructStats::Deserialize(obj, stats);
			break;
		case StatisticsType::ARRAY_STATS:
			ArrayStats::Deserialize(obj, stats);
			break;
		default:
			break;
		}
	});

	return stats;
}